

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

SmallVectorImpl<ParserError> * __thiscall
llvm_vecsmall::SmallVectorImpl<ParserError>::operator=
          (SmallVectorImpl<ParserError> *this,SmallVectorImpl<ParserError> *RHS)

{
  ParserError *__first;
  ParserError *pPVar1;
  ulong uVar2;
  ParserError *E;
  ulong uVar3;
  ParserError *__result;
  
  if (this == RHS) {
    return this;
  }
  __first = (ParserError *)
            (RHS->super_SmallVectorTemplateBase<ParserError,_false>).
            super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.BeginX;
  pPVar1 = (ParserError *)
           (RHS->super_SmallVectorTemplateBase<ParserError,_false>).
           super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX;
  uVar3 = (long)pPVar1 - (long)__first;
  __result = (ParserError *)
             (this->super_SmallVectorTemplateBase<ParserError,_false>).
             super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.BeginX;
  E = (ParserError *)
      (this->super_SmallVectorTemplateBase<ParserError,_false>).
      super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX;
  uVar2 = ((long)E - (long)__result) / 0x30;
  if ((ulong)((long)uVar3 / 0x30) <= uVar2) {
    if (pPVar1 != __first) {
      __result = std::__copy_move<false,false,std::random_access_iterator_tag>::
                 __copy_m<ParserError_const*,ParserError*>
                           (__first,(ParserError *)(uVar3 + (long)__first),__result);
      E = (ParserError *)
          (this->super_SmallVectorTemplateBase<ParserError,_false>).
          super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX;
    }
    SmallVectorTemplateBase<ParserError,_false>::destroy_range(__result,E);
    goto LAB_001c3465;
  }
  if ((ulong)((long)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                    super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.
                    CapacityX - (long)__result) < uVar3) {
    SmallVectorTemplateBase<ParserError,_false>::destroy_range(__result,E);
    (this->super_SmallVectorTemplateBase<ParserError,_false>).
    super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX =
         (this->super_SmallVectorTemplateBase<ParserError,_false>).
         super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.BeginX;
    SmallVectorTemplateBase<ParserError,_false>::grow
              (&this->super_SmallVectorTemplateBase<ParserError,_false>,(long)uVar3 / 0x30);
LAB_001c3449:
    uVar2 = 0;
  }
  else {
    if (E == __result) goto LAB_001c3449;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<ParserError_const*,ParserError*>
              (__first,(ParserError *)(((long)E - (long)__result) + (long)__first),__result);
  }
  std::__uninitialized_copy<false>::__uninit_copy<ParserError_const*,ParserError*>
            ((ParserError *)
             ((long)(RHS->super_SmallVectorTemplateBase<ParserError,_false>).
                    super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.BeginX
             + uVar2 * 0x30),
             (ParserError *)
             (RHS->super_SmallVectorTemplateBase<ParserError,_false>).
             super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX,
             (ParserError *)
             (uVar2 * 0x30 +
             (long)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                   super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.BeginX))
  ;
  __result = (ParserError *)
             (uVar3 + (long)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                            super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase
                            .BeginX);
LAB_001c3465:
  (this->super_SmallVectorTemplateBase<ParserError,_false>).
  super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX = __result;
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}